

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_audio_buffer_ref_seek_to_pcm_frame
                    (ma_audio_buffer_ref *pAudioBufferRef,ma_uint64 frameIndex)

{
  ma_uint64 frameIndex_local;
  ma_audio_buffer_ref *pAudioBufferRef_local;
  ma_result local_4;
  
  if (pAudioBufferRef == (ma_audio_buffer_ref *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else if (pAudioBufferRef->sizeInFrames < frameIndex) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    pAudioBufferRef->cursor = frameIndex;
    local_4 = MA_SUCCESS;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_audio_buffer_ref_seek_to_pcm_frame(ma_audio_buffer_ref* pAudioBufferRef, ma_uint64 frameIndex)
{
    if (pAudioBufferRef == NULL) {
        return MA_INVALID_ARGS;
    }

    if (frameIndex > pAudioBufferRef->sizeInFrames) {
        return MA_INVALID_ARGS;
    }

    pAudioBufferRef->cursor = (size_t)frameIndex;

    return MA_SUCCESS;
}